

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

void crnlib::SelectorNode::sort_task(uint64 data,void *ptr)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  lVar1 = *ptr;
  lVar2 = *(long *)((long)ptr + 8);
  if (lVar1 != lVar2) {
    uVar4 = lVar2 - lVar1 >> 3;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::__introsort_loop<unsigned_long_long*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (lVar1,lVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<unsigned_long_long*,__gnu_cxx::__ops::_Iter_less_iter>(lVar1,lVar2);
    return;
  }
  return;
}

Assistant:

static void sort_task(uint64 data, void* ptr)
        {
            std::sort(((SelectorNode*)ptr)->p, ((SelectorNode*)ptr)->pEnd);
        }